

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Value *pVVar1;
  int i;
  int iVar2;
  bool bVar3;
  allocator local_22a;
  allocator local_229;
  Value outputJSON;
  string stg;
  Value input_json;
  string myin;
  Value local_198;
  Value local_170;
  Reader reader;
  
  iVar2 = 5;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
    super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
    super__Deque_impl_data._M_map_size = 0;
    reader.nodes_.c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
    super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::push_back(&all_card_abi_cxx11_,(value_type *)&reader);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&reader);
  }
  input_json._8_2_ = input_json._8_2_ & 0xfe00;
  input_json.comments_ = (CommentInfo *)0x0;
  input_json.start_ = 0;
  input_json.limit_ = 0;
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string
            ((string *)&outputJSON,
             "{\"requests\":[\"0 2 1\",\"1 0 0 0 0 F3 T6 W5 B7 W2 T7 W1 B2 W9 T3 W4 W7 T5\",\"3 0 DRAW\",\"3 0 PLAY J2\",\"3 1 DRAW\",\"3 1 PLAY F3\",\"2 B3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W8\",\"3 0 DRAW\",\"3 0 PLAY B8\",\"3 3 PENG B2\",\"3 0 DRAW\",\"3 0 PLAY B4\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"3 2 CHI B3 W1\",\"3 3 DRAW\",\"3 3 PLAY B1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY B1\",\"2 F2\",\"3 2 PLAY F2\",\"3 3 DRAW\",\"3 3 PLAY J1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY J1\",\"2 W1\",\"3 2 PLAY W1\",\"3 3 DRAW\",\"3 3 PLAY T5\",\"3 0 DRAW\",\"3 0 PLAY B9\",\"3 1 DRAW\",\"3 1 PLAY J2\",\"2 F1\",\"3 2 PLAY F1\",\"3 3 DRAW\",\"3 3 PLAY T8\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 CHI B6 B9\",\"2 W4\",\"3 2 PLAY B7\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B3\",\"3 2 PLAY B3\",\"3 3 DRAW\",\"3 3 PLAY J2\",\"3 0 DRAW\",\"3 0 PLAY W7\",\"3 1 CHI W7 J3\",\"2 W5\",\"3 2 PLAY W7\",\"3 3 DRAW\",\"3 3 PLAY T3\",\"3 0 DRAW\",\"3 0 PLAY T9\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B2\",\"3 2 PLAY B2\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T3\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 W3\",\"3 2 PLAY W3\",\"3 3 CHI W2 W5\",\"3 2 PENG W2\",\"3 3 DRAW\",\"3 3 PLAY F3\",\"3 0 DRAW\",\"3 0 PLAY T2\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"2 J3\",\"3 2 PLAY J3\",\"3 3 DRAW\",\"3 3 PLAY T1\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY F1\",\"3 3 PENG W5\",\"3 0 DRAW\",\"3 0 PLAY W8\",\"3 1 DRAW\",\"3 1 PLAY B9\",\"2 F3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY T2\",\"2 W6\",\"3 2 PLAY T3\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY B3\",\"2 B8\",\"3 2 PLAY W6\",\"3 3 DRAW\",\"3 3 PLAY W7\",\"3 0 DRAW\",\"3 0 PLAY F2\",\"3 1 DRAW\",\"3 1 PLAY W9\",\"2 W4\",\"3 2 PLAY W9\",\"3 3 DRAW\",\"3 3 PLAY B9\",\"3 0 DRAW\",\"3 0 PLAY T8\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 B3\",\"3 2 PLAY T5\",\"3 3 DRAW\",\"3 3 PLAY J3\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY B6\",\"2 B2\",\"3 2 PLAY B8\",\"3 3 DRAW\",\"3 3 PLAY T2\",\"3 0 DRAW\",\"3 0 PLAY J1\",\"3 1 DRAW\",\"3 1 PLAY T9\",\"2 T6\",\"3 2 PLAY T7\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F2\"],\"responses\":[\"PASS\",\"PASS\",\"PASS\",\"PASS"
             ,&local_229);
  std::__cxx11::string::string
            ((string *)&stg,
             "\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"CHI B3 W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W3\",\"PASS\",\"PENG W2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY J3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W6\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W9\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T5\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B8\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\"]}"
             ,&local_22a);
  std::operator+(&myin,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &outputJSON,&stg);
  std::__cxx11::string::~string((string *)&stg);
  std::__cxx11::string::~string((string *)&outputJSON);
  Json::Reader::parse(&reader,&myin,&input_json,true);
  pVVar1 = Json::Value::operator[](&input_json,"responses");
  turn_id = Json::Value::size(pVVar1);
  for (iVar2 = 0; iVar2 < turn_id; iVar2 = iVar2 + 1) {
    pVVar1 = Json::Value::operator[](&input_json,"requests");
    pVVar1 = Json::Value::operator[](pVVar1,iVar2);
    Json::Value::asString_abi_cxx11_((string *)&outputJSON,pVVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &request_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputJSON);
    std::__cxx11::string::~string((string *)&outputJSON);
    pVVar1 = Json::Value::operator[](&input_json,"responses");
    pVVar1 = Json::Value::operator[](pVVar1,iVar2);
    Json::Value::asString_abi_cxx11_((string *)&outputJSON,pVVar1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &response_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputJSON);
    std::__cxx11::string::~string((string *)&outputJSON);
  }
  pVVar1 = Json::Value::operator[](&input_json,"requests");
  pVVar1 = Json::Value::operator[](pVVar1,turn_id);
  Json::Value::asString_abi_cxx11_((string *)&outputJSON,pVVar1);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &request_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputJSON);
  std::__cxx11::string::~string((string *)&outputJSON);
  if (turn_id < 2) {
    std::__cxx11::string::string((string *)&outputJSON,"PASS",(allocator *)&stg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &response_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputJSON);
  }
  else {
    initCondition_abi_cxx11_();
    std::__cxx11::string::operator=((string *)&stmp_abi_cxx11_,(string *)&outputJSON);
    std::__cxx11::string::~string((string *)&outputJSON);
    std::__cxx11::string::_M_assign((string *)&current_card_abi_cxx11_);
    std::ios::clear((int)*(undefined8 *)(str_in_abi_cxx11_ + -0x18) + 0x12f488);
    std::__cxx11::stringbuf::str((string *)&DAT_0012f498);
    std::istream::operator>>((istream *)&str_in_abi_cxx11_,&itmp);
    if (itmp == 3) {
      bVar3 = std::operator!=(&stmp_abi_cxx11_,"Fail");
      if (bVar3) {
        responseOutTurn();
      }
      else {
        std::operator<<((ostream *)str_out_abi_cxx11_,"PASS");
      }
    }
    else if (itmp == 2) {
      playCard();
    }
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &response_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outputJSON);
  }
  std::__cxx11::string::~string((string *)&outputJSON);
  outputJSON._8_2_ = 0;
  outputJSON.comments_ = (CommentInfo *)0x0;
  outputJSON.start_ = 0;
  outputJSON.limit_ = 0;
  Json::Value::Value(&local_170,
                     response_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + turn_id);
  pVVar1 = Json::Value::operator[](&outputJSON,"response");
  Json::Value::swap(pVVar1,&local_170);
  Json::Value::~Value(&local_170);
  stg._M_dataplus._M_p = (pointer)&stg.field_2;
  stg._M_string_length = 0;
  stg.field_2._M_local_buf[0] = '\0';
  if (current_strategy - 1U < 3) {
    std::__cxx11::string::assign((char *)&stg);
  }
  Json::Value::Value(&local_198,&stg);
  pVVar1 = Json::Value::operator[](&outputJSON,"debug");
  Json::Value::swap(pVVar1,&local_198);
  Json::Value::~Value(&local_198);
  Json::operator<<((ostream *)&std::cout,&outputJSON);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::__cxx11::string::~string((string *)&stg);
  Json::Value::~Value(&outputJSON);
  std::__cxx11::string::~string((string *)&myin);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&input_json);
  return 0;
}

Assistant:

int main() {
    //初始化all_card 0-3是四个玩家，4是桌上的牌
    for (int i = 0; i < 5; i++) {
        vector<string> vtmp;
        all_card.push_back(vtmp);
    }

    //
    //Json交互的输入（删掉了普通交互）
    Json::Value input_json;
#ifdef _BOTZONE_ONLINE
    cin >> input_json;
#else
    //==========debug============
    Json::Reader reader;
    string myin = string("{\"requests\":[\"0 2 1\",\"1 0 0 0 0 F3 T6 W5 B7 W2 T7 W1 B2 W9 T3 W4 W7 T5\",\"3 0 DRAW\",\"3 0 PLAY J2\",\"3 1 DRAW\",\"3 1 PLAY F3\",\"2 B3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W8\",\"3 0 DRAW\",\"3 0 PLAY B8\",\"3 3 PENG B2\",\"3 0 DRAW\",\"3 0 PLAY B4\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"3 2 CHI B3 W1\",\"3 3 DRAW\",\"3 3 PLAY B1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY B1\",\"2 F2\",\"3 2 PLAY F2\",\"3 3 DRAW\",\"3 3 PLAY J1\",\"3 0 DRAW\",\"3 0 PLAY B5\",\"3 1 DRAW\",\"3 1 PLAY J1\",\"2 W1\",\"3 2 PLAY W1\",\"3 3 DRAW\",\"3 3 PLAY T5\",\"3 0 DRAW\",\"3 0 PLAY B9\",\"3 1 DRAW\",\"3 1 PLAY J2\",\"2 F1\",\"3 2 PLAY F1\",\"3 3 DRAW\",\"3 3 PLAY T8\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 CHI B6 B9\",\"2 W4\",\"3 2 PLAY B7\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B3\",\"3 2 PLAY B3\",\"3 3 DRAW\",\"3 3 PLAY J2\",\"3 0 DRAW\",\"3 0 PLAY W7\",\"3 1 CHI W7 J3\",\"2 W5\",\"3 2 PLAY W7\",\"3 3 DRAW\",\"3 3 PLAY T3\",\"3 0 DRAW\",\"3 0 PLAY T9\",\"3 1 DRAW\",\"3 1 PLAY F4\",\"2 B2\",\"3 2 PLAY B2\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T3\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 W3\",\"3 2 PLAY W3\",\"3 3 CHI W2 W5\",\"3 2 PENG W2\",\"3 3 DRAW\",\"3 3 PLAY F3\",\"3 0 DRAW\",\"3 0 PLAY T2\",\"3 1 DRAW\",\"3 1 PLAY B4\",\"2 J3\",\"3 2 PLAY J3\",\"3 3 DRAW\",\"3 3 PLAY T1\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY F1\",\"3 3 PENG W5\",\"3 0 DRAW\",\"3 0 PLAY W8\",\"3 1 DRAW\",\"3 1 PLAY B9\",\"2 F3\",\"3 2 PLAY F3\",\"3 3 DRAW\",\"3 3 PLAY W3\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY T2\",\"2 W6\",\"3 2 PLAY T3\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY T1\",\"3 1 DRAW\",\"3 1 PLAY B3\",\"2 B8\",\"3 2 PLAY W6\",\"3 3 DRAW\",\"3 3 PLAY W7\",\"3 0 DRAW\",\"3 0 PLAY F2\",\"3 1 DRAW\",\"3 1 PLAY W9\",\"2 W4\",\"3 2 PLAY W9\",\"3 3 DRAW\",\"3 3 PLAY B9\",\"3 0 DRAW\",\"3 0 PLAY T8\",\"3 1 DRAW\",\"3 1 PLAY W2\",\"2 B3\",\"3 2 PLAY T5\",\"3 3 DRAW\",\"3 3 PLAY J3\",\"3 0 DRAW\",\"3 0 PLAY B6\",\"3 1 DRAW\",\"3 1 PLAY B6\",\"2 B2\",\"3 2 PLAY B8\",\"3 3 DRAW\",\"3 3 PLAY T2\",\"3 0 DRAW\",\"3 0 PLAY J1\",\"3 1 DRAW\",\"3 1 PLAY T9\",\"2 T6\",\"3 2 PLAY T7\",\"3 3 DRAW\",\"3 3 PLAY B7\",\"3 0 DRAW\",\"3 0 PLAY B1\",\"3 1 DRAW\",\"3 1 PLAY F2\"],\"responses\":[\"PASS\",\"PASS\",\"PASS\",\"PASS") + string("\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"CHI B3 W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F1\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W3\",\"PASS\",\"PENG W2\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY J3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY F3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T3\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W6\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY W9\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T5\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY B8\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PLAY T7\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\",\"PASS\"]}");
    reader.parse(myin, input_json);
    //==========debug============
#endif
    //当前回合的下标（即总共回合数量-1）
    turn_id = input_json["responses"].size();
    //读取交互信息，存入request和response
    for (int i = 0; i < turn_id; i++) {
        request.push_back(input_json["requests"][i].asString());
        response.push_back(input_json["responses"][i].asString());
    }
    request.push_back(input_json["requests"][turn_id].asString());

    if (turn_id < 2) { //如果当前回合数是1或0
        response.push_back("PASS");
    }
    else { //如果这局itmp是2，stmp就是我在这局摸到的牌，如果这局itmp是3，只有别的玩家出牌了才会返回出的是什么牌，其他都返回“Fail”
        stmp = initCondition();
        //stmp = "Fail";//debug用
        current_card = stmp;
        str_in.clear();
        str_in.str(request[turn_id]);
        str_in >> itmp;
        //for (int i = 0; i < all_card[my_player_id].size(); i++)
        //	str_out << all_card[my_player_id][i] << " ";
        if (itmp == 2) { //到我的时候，这时stmp就是牌的信息
            playCard();
        }
            //3 2 PLAY T1
        else if (itmp == 3) {
            if (stmp != "Fail") {
                //bugang
                //if (find(peng.begin(), peng.end(), stmp) != peng.end()) {
                //	doBUGANG();
                //}
                //else{
                //str_out << stmp << " ";
                //str_out << "PASS";
                responseOutTurn();
                //}
            }
            else
                str_out << "PASS";
        }
        response.push_back(str_out.str());
    }

    //Json交互的输出（删掉了普通交互）
    Json::Value outputJSON;
    outputJSON["response"] = response[turn_id];

    //========debug==========
    string stg;
    if (current_strategy == STG_PENG_PENG) { stg = "碰碰胡";}
    else if (current_strategy == STG_HUN_YI_SE) { stg = "混一色"; }
    else if (current_strategy == STG_QUAN_QIU_REN) { stg = "全求人"; }
    else if (current_strategy == STG_WU_MEN) { stg = "五门齐"; }
    outputJSON["debug"] = stg;
    //========debug==========

    cout << outputJSON << endl;
    return 0;
}